

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<12UL>
mserialize::cx_strcat<4ul,4ul,4ul>
          (cx_string<4UL> *strings,cx_string<4UL> *strings_1,cx_string<4UL> *strings_2)

{
  cx_string<4UL> *in_RDX;
  cx_string<4UL> *in_RSI;
  cx_string<4UL> *in_RDI;
  cx_string<12UL> cVar1;
  size_t s;
  size_t i;
  char *out;
  size_t size [4];
  char *data [4];
  char buffer [13];
  ulong local_90;
  ulong local_88;
  char *local_80;
  ulong local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  char *local_58;
  data_ref local_50;
  data_ref local_48;
  data_ref local_40;
  char local_35 [13];
  cx_string<4UL> *local_28;
  cx_string<4UL> *local_20;
  cx_string<4UL> *local_18;
  cx_string<12UL> local_d;
  
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  memset(local_35,0,0xd);
  local_58 = "";
  local_50 = cx_string<4UL>::data(local_18);
  local_48 = cx_string<4UL>::data(local_20);
  local_40 = cx_string<4UL>::data(local_28);
  local_78 = 0;
  local_70 = cx_string<4UL>::size(local_18);
  local_68 = cx_string<4UL>::size(local_20);
  local_60 = cx_string<4UL>::size(local_28);
  local_80 = local_35;
  for (local_88 = 1; local_88 < 4; local_88 = local_88 + 1) {
    for (local_90 = 0; local_90 < (&local_78)[local_88]; local_90 = local_90 + 1) {
      *local_80 = (&local_58)[local_88][local_90];
      local_80 = local_80 + 1;
    }
  }
  cx_string<12UL>::cx_string(&local_d,local_35);
  cVar1._data[5] = local_d._data[5];
  cVar1._data[6] = local_d._data[6];
  cVar1._data[7] = local_d._data[7];
  cVar1._data[0] = local_d._data[0];
  cVar1._data[1] = local_d._data[1];
  cVar1._data[2] = local_d._data[2];
  cVar1._data[3] = local_d._data[3];
  cVar1._data[4] = local_d._data[4];
  cVar1._data[8] = local_d._data[8];
  cVar1._data[9] = local_d._data[9];
  cVar1._data[10] = local_d._data[10];
  cVar1._data[0xb] = local_d._data[0xb];
  cVar1._data[0xc] = local_d._data[0xc];
  return (cx_string<12UL>)cVar1._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}